

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnviewgrip.cpp
# Opt level: O0

int __thiscall QColumnViewGrip::moveGrip(QColumnViewGrip *this,int offset)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int in_ESI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  int oldX;
  int realOffset;
  int oldWidth;
  QWidget *parentWidget;
  int newWidth;
  int in_stack_ffffffffffffffac;
  QWidget *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  int local_30;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::parent((QObject *)0x86f50e);
  iVar2 = QWidget::width((QWidget *)0x86f51d);
  local_c = iVar2;
  bVar1 = QWidget::isRightToLeft((QWidget *)0x86f533);
  if (bVar1) {
    local_c = local_c - in_ESI;
  }
  else {
    local_c = in_ESI + local_c;
  }
  local_10 = QWidget::minimumWidth(in_stack_ffffffffffffffb0);
  piVar4 = qMax<int>(&local_10,&local_c);
  iVar3 = *piVar4;
  local_c = iVar3;
  QWidget::height((QWidget *)0x86f594);
  QWidget::resize(in_RDI,iVar3,in_stack_ffffffffffffffb8);
  local_30 = QWidget::width((QWidget *)0x86f5ae);
  local_30 = local_30 - iVar2;
  iVar2 = QWidget::x(in_RDI);
  if (local_30 != 0) {
    gripMoved((QColumnViewGrip *)0x86f5d9,in_stack_ffffffffffffffac);
  }
  bVar1 = QWidget::isRightToLeft((QWidget *)0x86f5e3);
  if (bVar1) {
    iVar3 = QWidget::x(in_RDI);
    local_30 = -(iVar2 - iVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

int QColumnViewGrip::moveGrip(int offset)
{
    QWidget *parentWidget = (QWidget*)parent();

    // first resize the parent
    int oldWidth = parentWidget->width();
    int newWidth = oldWidth;
    if (isRightToLeft())
       newWidth -= offset;
    else
       newWidth += offset;
    newWidth = qMax(parentWidget->minimumWidth(), newWidth);
    parentWidget->resize(newWidth, parentWidget->height());

    // Then have the view move the widget
    int realOffset = parentWidget->width() - oldWidth;
    int oldX = parentWidget->x();
    if (realOffset != 0)
        emit gripMoved(realOffset);
    if (isRightToLeft())
        realOffset = -1 * (oldX - parentWidget->x());
    return realOffset;
}